

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  char *__s2;
  long lVar1;
  int iVar2;
  char *__ptr;
  void *__ptr_00;
  char *pcVar3;
  void *__ptr_01;
  size_t sVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  wchar_t wVar10;
  size_t __size;
  size_t buff_size;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __ptr = slurpfile(&buff_size,"%s");
  if (__ptr == (char *)0x0) {
    failure_start(pathname,line,"Can\'t read file: %s",pathname);
LAB_001064e2:
    wVar10 = L'\0';
    failure_finish(pathname);
  }
  else {
    lVar8 = -1;
    lVar9 = 8;
    do {
      lVar9 = lVar9 + -8;
      lVar1 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (lines[lVar1] != (char *)0x0);
    if (lVar8 == 0) {
      __ptr_00 = (void *)0x0;
    }
    else {
      __ptr_00 = malloc(-lVar9);
      if (__ptr_00 == (void *)0x0) {
        failure_start(pathname,line,"Can\'t allocate memory");
        goto LAB_001064e2;
      }
      for (lVar9 = 0; *(char **)((long)lines + lVar9) != (char *)0x0; lVar9 = lVar9 + 8) {
        pcVar3 = strdup(*(char **)((long)lines + lVar9));
        *(char **)((long)__ptr_00 + lVar9) = pcVar3;
      }
    }
    __size = 0;
    cVar6 = '\0';
    for (pcVar3 = __ptr; pcVar3 < __ptr + buff_size; pcVar3 = pcVar3 + 1) {
      cVar5 = *pcVar3;
      if ((cVar5 == '\r') || (cVar5 == '\n')) {
        *pcVar3 = '\0';
        cVar5 = '\0';
      }
      __size = __size + (cVar5 != '\0' && cVar6 == '\0');
      cVar6 = cVar5;
    }
    if (__size == 0) {
      __ptr_01 = (void *)0x0;
    }
    else {
      __ptr_01 = calloc(8,__size);
      if (__ptr_01 == (void *)0x0) {
        failure_start(pathname,line,"Can\'t allocate memory");
        failure_finish(pathname);
        free(__ptr_00);
        return L'\0';
      }
      lVar9 = 0;
      for (pcVar3 = __ptr; pcVar3 < __ptr + buff_size; pcVar3 = pcVar3 + sVar4 + 1) {
        if (*pcVar3 != '\0') {
          *(char **)((long)__ptr_01 + lVar9 * 8) = pcVar3;
          lVar9 = lVar9 + 1;
        }
        sVar4 = strlen(pcVar3);
      }
    }
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      pcVar3 = *(char **)((long)__ptr_00 + lVar9 * 8);
      if (pcVar3 != (char *)0x0) {
        for (sVar4 = 0; __size != sVar4; sVar4 = sVar4 + 1) {
          __s2 = *(char **)((long)__ptr_01 + sVar4 * 8);
          if ((__s2 != (char *)0x0) && (iVar2 = strcmp(pcVar3,__s2), iVar2 == 0)) {
            free(pcVar3);
            *(undefined8 *)((long)__ptr_00 + lVar9 * 8) = 0;
            *(undefined8 *)((long)__ptr_01 + sVar4 * 8) = 0;
            break;
          }
        }
      }
    }
    iVar2 = 0;
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      iVar2 = (iVar2 + 1) - (uint)(*(long *)((long)__ptr_00 + lVar9 * 8) == 0);
    }
    iVar7 = 0;
    for (sVar4 = 0; __size != sVar4; sVar4 = sVar4 + 1) {
      iVar7 = (iVar7 + 1) - (uint)(*(long *)((long)__ptr_01 + sVar4 * 8) == 0);
    }
    if (iVar2 == 0 && iVar7 == 0) {
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      wVar10 = L'\x01';
    }
    else {
      failure_start(file,line,"File doesn\'t match: %s",pathname);
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
        if (*(long *)((long)__ptr_00 + lVar9 * 8) != 0) {
          logprintf("  Expected but not present: %s\n");
          file = *(char **)((long)__ptr_00 + lVar9 * 8);
          free(file);
        }
      }
      for (sVar4 = 0; __size != sVar4; sVar4 = sVar4 + 1) {
        if (*(long *)((long)__ptr_01 + sVar4 * 8) != 0) {
          file = "  Present but not expected: %s\n";
          logprintf("  Present but not expected: %s\n");
        }
      }
      failure_finish(file);
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      wVar10 = L'\0';
    }
  }
  return wVar10;
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = malloc(sizeof(char *) * expected_count);
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			return (0);
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(sizeof(char *), actual_count);
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			free(expected);
			return (0);
		}
		for (j = 0, p = buff; p < buff + buff_size; p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] == NULL)
			continue;
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(buff);
		free(expected);
		free(actual);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
	free(buff);
	free(expected);
	free(actual);
	return (0);
}